

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

common_sampler * common_sampler_init(llama_model *model,common_params_sampling *params)

{
  undefined4 uVar1;
  common_grammar_trigger_type cVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  char **ppcVar10;
  size_type sVar11;
  int *piVar12;
  common_sampler *pcVar13;
  llama_sampler *plVar14;
  llama_logit_bias *plVar15;
  undefined8 uVar16;
  undefined4 *in_RSI;
  undefined8 in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  const_iterator __end5;
  const_iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  vector<const_char_*,_std::allocator<const_char_*>_> c_breakers;
  common_sampler_type *cnstr;
  const_iterator __end3;
  const_iterator __begin3;
  vector<common_sampler_type,_std::allocator<common_sampler_type>_> *__range3;
  common_sampler *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *regex;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  vector<const_char_*,_std::allocator<const_char_*>_> trigger_patterns_c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  trigger_patterns;
  llama_token token;
  string *pattern;
  string *word;
  common_grammar_trigger *trigger;
  const_iterator __end2;
  const_iterator __begin2;
  vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_> *__range2;
  vector<int,_std::allocator<int>_> trigger_tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  patterns_anywhere;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  patterns_at_start;
  llama_sampler *grmr;
  llama_sampler_chain_params lparams;
  llama_vocab *vocab;
  value_type *in_stack_fffffffffffffb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbb8;
  size_t in_stack_fffffffffffffbc8;
  ring_buffer<int> *in_stack_fffffffffffffbd0;
  common_params_sampling *in_stack_fffffffffffffbd8;
  common_params_sampling *in_stack_fffffffffffffbe0;
  llama_sampler *local_330;
  string *in_stack_fffffffffffffd40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  undefined4 *local_2a0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_298;
  reference local_280;
  common_sampler_type *local_278;
  __normal_iterator<const_common_sampler_type_*,_std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>_>
  local_270;
  undefined4 *local_268;
  int local_260;
  byte local_259;
  common_sampler *local_258;
  uint local_24c;
  undefined8 local_248;
  reference local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_228;
  vector<const_char_*,_std::allocator<const_char_*>_> local_220;
  allocator<char> local_201;
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  llama_token local_dc;
  string *local_d8;
  string local_c0 [32];
  string *local_a0;
  reference local_98;
  common_grammar_trigger *local_90;
  __normal_iterator<const_common_grammar_trigger_*,_std::vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>_>
  local_88;
  undefined4 *local_80;
  vector<int,_std::allocator<int>_> local_78 [3];
  llama_sampler *local_30;
  byte local_21;
  undefined8 local_20;
  undefined4 *local_18;
  undefined8 local_10;
  common_sampler *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = llama_model_get_vocab(in_RDI);
  llama_sampler_chain_default_params();
  local_21 = *(byte *)((long)local_18 + 0x65) & 1;
  iVar6 = std::__cxx11::string::compare((ulong)(local_18 + 0x26),0,(char *)0xb);
  if (iVar6 == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
               ,0xa0,"llguidance (cmake -DLLAMA_LLGUIDANCE=ON) is not enabled");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x37e9bc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x37e9c9);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x37e9d6);
  local_80 = local_18 + 0x30;
  local_88._M_current =
       (common_grammar_trigger *)
       std::vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>::begin
                 ((vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_> *)
                  in_stack_fffffffffffffb98);
  local_90 = (common_grammar_trigger *)
             std::vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>::end
                       ((vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_> *)
                        in_stack_fffffffffffffb98);
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_common_grammar_trigger_*,_std::vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>_>
                             *)in_stack_fffffffffffffba0,
                            (__normal_iterator<const_common_grammar_trigger_*,_std::vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>_>
                             *)in_stack_fffffffffffffb98), bVar5) {
    local_98 = __gnu_cxx::
               __normal_iterator<const_common_grammar_trigger_*,_std::vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>_>
               ::operator*(&local_88);
    cVar2 = local_98->type;
    if (cVar2 == COMMON_GRAMMAR_TRIGGER_TYPE_TOKEN) {
      local_dc = local_98->token;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbb0,
                 (value_type_conflict *)in_stack_fffffffffffffba8);
    }
    else if (cVar2 == COMMON_GRAMMAR_TRIGGER_TYPE_WORD) {
      local_a0 = &local_98->value;
      regex_escape(in_stack_fffffffffffffbb8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      std::__cxx11::string::~string(local_c0);
    }
    else if (cVar2 - COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN < 2) {
      local_d8 = &local_98->value;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    }
    else {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
                 ,0xbc,"GGML_ASSERT(%s) failed","false && \"unknown trigger type\"");
    }
    __gnu_cxx::
    __normal_iterator<const_common_grammar_trigger_*,_std::vector<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>_>
    ::operator++(&local_88);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x37ebea);
  bVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffbb0);
  if (!bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8,
               (allocator<char> *)in_stack_fffffffffffffbd0);
    string_join(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    std::operator+((char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator(&local_179);
  }
  bVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffbb0);
  if (!bVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8,
               (allocator<char> *)in_stack_fffffffffffffbd0);
    string_join(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    std::operator+((char *)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    std::operator+(in_stack_fffffffffffffba8,(char *)in_stack_fffffffffffffba0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator(&local_201);
  }
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x37ef69);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(&local_f8);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffbd0,
             in_stack_fffffffffffffbc8);
  local_228 = &local_f8;
  local_230._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb98);
  local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffb98);
  while (bVar5 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffba0,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb98), uVar16 = local_20, bVar5) {
    local_240 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_230);
    local_248 = std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffba0,
               (value_type *)in_stack_fffffffffffffb98);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_230);
  }
  if ((*(byte *)(local_18 + 0x2e) & 1) == 0) {
    uVar9 = std::__cxx11::string::c_str();
    local_330 = (llama_sampler *)llama_sampler_init_grammar(uVar16,uVar9,"root");
  }
  else {
    uVar9 = std::__cxx11::string::c_str();
    ppcVar10 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x37f0ab);
    sVar11 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_220);
    piVar12 = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x37f0dd);
    in_stack_fffffffffffffb98 = (value_type *)std::vector<int,_std::allocator<int>_>::size(local_78)
    ;
    local_330 = (llama_sampler *)
                llama_sampler_init_grammar_lazy_patterns
                          (uVar16,uVar9,"root",ppcVar10,sVar11,piVar12);
  }
  local_30 = local_330;
  if (local_330 == (llama_sampler *)0x0) {
    local_8 = (common_sampler *)0x0;
  }
  local_24c = (uint)(local_330 == (llama_sampler *)0x0);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(in_stack_fffffffffffffbb0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffbb0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbb0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffbb0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffbb0);
  if (local_24c == 0) {
    pcVar13 = (common_sampler *)operator_new(0x1a0);
    common_params_sampling::common_params_sampling
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    pcVar13->grmr = local_30;
    local_259 = local_21;
    plVar14 = (llama_sampler *)llama_sampler_chain_init(local_21);
    pcVar13->chain = plVar14;
    local_260 = 0x20;
    std::max<int>(&local_260,local_18 + 1);
    ring_buffer<int>::ring_buffer(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    memset(&pcVar13->cur,0,0x18);
    std::vector<llama_token_data,_std::allocator<llama_token_data>_>::vector
              ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)0x37f38c);
    memset(&pcVar13->cur_p,0,0x20);
    plVar14 = pcVar13->chain;
    local_258 = pcVar13;
    uVar7 = llama_vocab_n_tokens(local_20);
    sVar11 = std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::size
                       ((vector<llama_logit_bias,_std::allocator<llama_logit_bias>_> *)
                        (local_18 + 0x42));
    plVar15 = std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::data
                        ((vector<llama_logit_bias,_std::allocator<llama_logit_bias>_> *)0x37f411);
    uVar16 = llama_sampler_init_logit_bias(uVar7,sVar11 & 0xffffffff,plVar15);
    llama_sampler_chain_add(plVar14,uVar16);
    if (local_18[0x15] == 0) {
      if ((float)local_18[0x16] < 0.0) {
        local_268 = local_18 + 0x20;
        local_270._M_current =
             (common_sampler_type *)
             std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>::begin
                       ((vector<common_sampler_type,_std::allocator<common_sampler_type>_> *)
                        in_stack_fffffffffffffb98);
        local_278 = (common_sampler_type *)
                    std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>::end
                              ((vector<common_sampler_type,_std::allocator<common_sampler_type>_> *)
                               in_stack_fffffffffffffb98);
        while (bVar5 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_common_sampler_type_*,_std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>_>
                                   *)in_stack_fffffffffffffba0,
                                  (__normal_iterator<const_common_sampler_type_*,_std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>_>
                                   *)in_stack_fffffffffffffb98), bVar5) {
          local_280 = __gnu_cxx::
                      __normal_iterator<const_common_sampler_type_*,_std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>_>
                      ::operator*(&local_270);
          switch(*local_280) {
          case COMMON_SAMPLER_TYPE_DRY:
            std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x37f61d);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_18 + 0x1a));
            std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
                      ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                       in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
            local_2a0 = local_18 + 0x1a;
            local_2a8._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffb98);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffb98);
            while (bVar5 = __gnu_cxx::operator!=
                                     ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)in_stack_fffffffffffffba0,
                                      (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)in_stack_fffffffffffffb98), uVar16 = local_20, bVar5) {
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_2a8);
              std::__cxx11::string::c_str();
              std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                         in_stack_fffffffffffffba0,(value_type *)in_stack_fffffffffffffb98);
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_2a8);
            }
            plVar14 = local_258->chain;
            uVar8 = llama_model_n_ctx_train(local_10);
            uVar7 = local_18[0x11];
            uVar1 = local_18[0x12];
            uVar3 = local_18[0x13];
            uVar4 = local_18[0x14];
            ppcVar10 = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                                 ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x37f798);
            sVar11 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&local_298);
            uVar16 = llama_sampler_init_dry(uVar7,uVar1,uVar16,uVar8,uVar3,uVar4,ppcVar10,sVar11);
            llama_sampler_chain_add(plVar14,uVar16);
            std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                      (in_stack_fffffffffffffbb0);
            break;
          case COMMON_SAMPLER_TYPE_TOP_K:
            plVar14 = local_258->chain;
            uVar16 = llama_sampler_init_top_k(local_18[4]);
            llama_sampler_chain_add(plVar14,uVar16);
            break;
          case COMMON_SAMPLER_TYPE_TOP_P:
            plVar14 = local_258->chain;
            uVar16 = llama_sampler_init_top_p(local_18[5],(long)(int)local_18[3]);
            llama_sampler_chain_add(plVar14,uVar16);
            break;
          case COMMON_SAMPLER_TYPE_MIN_P:
            plVar14 = local_258->chain;
            uVar16 = llama_sampler_init_min_p(local_18[6],(long)(int)local_18[3]);
            llama_sampler_chain_add(plVar14,uVar16);
            break;
          default:
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
                       ,0x113,"GGML_ASSERT(%s) failed","false && \"unknown sampler type\"");
            break;
          case COMMON_SAMPLER_TYPE_TYPICAL_P:
            plVar14 = local_258->chain;
            uVar16 = llama_sampler_init_typical(local_18[9],(long)(int)local_18[3]);
            llama_sampler_chain_add(plVar14,uVar16);
            break;
          case COMMON_SAMPLER_TYPE_TEMPERATURE:
            plVar14 = local_258->chain;
            uVar16 = llama_sampler_init_temp_ext(local_18[10],local_18[0xb],local_18[0xc]);
            llama_sampler_chain_add(plVar14,uVar16);
            break;
          case COMMON_SAMPLER_TYPE_XTC:
            plVar14 = local_258->chain;
            uVar16 = llama_sampler_init_xtc
                               (local_18[7],local_18[8],(long)(int)local_18[3],*local_18);
            llama_sampler_chain_add(plVar14,uVar16);
            break;
          case COMMON_SAMPLER_TYPE_INFILL:
            plVar14 = local_258->chain;
            uVar16 = llama_sampler_init_infill(local_20);
            llama_sampler_chain_add(plVar14,uVar16);
            break;
          case COMMON_SAMPLER_TYPE_PENALTIES:
            in_stack_fffffffffffffbd0 = (ring_buffer<int> *)local_258->chain;
            uVar16 = llama_sampler_init_penalties
                               (local_18[0xe],local_18[0xf],local_18[0x10],local_18[0xd]);
            llama_sampler_chain_add(in_stack_fffffffffffffbd0,uVar16);
          }
          __gnu_cxx::
          __normal_iterator<const_common_sampler_type_*,_std::vector<common_sampler_type,_std::allocator<common_sampler_type>_>_>
          ::operator++(&local_270);
        }
      }
      else {
        plVar14 = local_258->chain;
        uVar16 = llama_sampler_init_top_k(local_18[4]);
        llama_sampler_chain_add(plVar14,uVar16);
        plVar14 = local_258->chain;
        uVar16 = llama_sampler_init_temp(local_18[10]);
        llama_sampler_chain_add(plVar14,uVar16);
        plVar14 = local_258->chain;
        uVar16 = llama_sampler_init_top_n_sigma(local_18[0x16]);
        llama_sampler_chain_add(plVar14,uVar16);
      }
      plVar14 = local_258->chain;
      uVar16 = llama_sampler_init_dist(*local_18);
      llama_sampler_chain_add(plVar14,uVar16);
    }
    else if (local_18[0x15] == 1) {
      plVar14 = local_258->chain;
      uVar16 = llama_sampler_init_temp(local_18[10]);
      llama_sampler_chain_add(plVar14,uVar16);
      plVar14 = local_258->chain;
      uVar7 = llama_vocab_n_tokens(local_20);
      uVar16 = llama_sampler_init_mirostat(local_18[0x17],local_18[0x18],uVar7,*local_18,100);
      llama_sampler_chain_add(plVar14,uVar16);
    }
    else if (local_18[0x15] == 2) {
      plVar14 = local_258->chain;
      uVar16 = llama_sampler_init_temp(local_18[10]);
      llama_sampler_chain_add(plVar14,uVar16);
      plVar14 = local_258->chain;
      uVar16 = llama_sampler_init_mirostat_v2(local_18[0x17],local_18[0x18],*local_18);
      llama_sampler_chain_add(plVar14,uVar16);
    }
    else {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
                 ,0x11f,"GGML_ASSERT(%s) failed","false && \"unknown mirostat version\"");
    }
    local_8 = local_258;
  }
  return local_8;
}

Assistant:

struct common_sampler * common_sampler_init(const struct llama_model * model, const struct common_params_sampling & params) {
    const llama_vocab * vocab = llama_model_get_vocab(model);

    llama_sampler_chain_params lparams = llama_sampler_chain_default_params();

    lparams.no_perf = params.no_perf;

    struct llama_sampler * grmr;
    if (params.grammar.compare(0, 11, "%llguidance") == 0) {
#ifdef LLAMA_USE_LLGUIDANCE
        grmr = llama_sampler_init_llg(vocab, "lark", params.grammar.c_str());
#else
        GGML_ABORT("llguidance (cmake -DLLAMA_LLGUIDANCE=ON) is not enabled");
#endif // LLAMA_USE_LLGUIDANCE
    } else {
        std::vector<std::string> patterns_at_start;
        std::vector<std::string> patterns_anywhere;
        std::vector<llama_token> trigger_tokens;
        for (const auto & trigger : params.grammar_triggers) {
            switch (trigger.type) {
                case COMMON_GRAMMAR_TRIGGER_TYPE_WORD:
                {
                    const auto & word = trigger.value;
                    patterns_anywhere.push_back(regex_escape(word));
                    break;
                }
                case COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN:
                case COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN_START:
                {
                    const auto & pattern = trigger.value;
                    (trigger.type == COMMON_GRAMMAR_TRIGGER_TYPE_PATTERN_START ? patterns_at_start : patterns_anywhere).push_back(pattern);
                    break;
                }
                case COMMON_GRAMMAR_TRIGGER_TYPE_TOKEN:
                {
                    const auto token = trigger.token;
                    trigger_tokens.push_back(token);
                    break;
                }
                default:
                    GGML_ASSERT(false && "unknown trigger type");
            }
        }

        std::vector<std::string> trigger_patterns;
        if (!patterns_at_start.empty()) {
            trigger_patterns.push_back("^(" + string_join(patterns_at_start, "|") + ")[\\s\\S]*");
        }
        if (!patterns_anywhere.empty()) {
            trigger_patterns.push_back("^[\\s\\S]*?(" + string_join(patterns_anywhere, "|") + ")[\\s\\S]*");
        }

        std::vector<const char *> trigger_patterns_c;
        trigger_patterns_c.reserve(trigger_patterns.size());
        for (const auto & regex : trigger_patterns) {
            trigger_patterns_c.push_back(regex.c_str());
        }

        grmr = params.grammar_lazy
             ? llama_sampler_init_grammar_lazy_patterns(vocab, params.grammar.c_str(), "root",
                                                        trigger_patterns_c.data(), trigger_patterns_c.size(),
                                                        trigger_tokens.data(), trigger_tokens.size())
             :      llama_sampler_init_grammar(vocab, params.grammar.c_str(), "root");
        if (!grmr) {
            return nullptr;
        }
    }

    auto * result = new common_sampler {
        /* .params = */ params,
        /* .grmr   = */ grmr,
        /* .chain  = */ llama_sampler_chain_init(lparams),
        /* .prev   = */ ring_buffer<llama_token>(std::max(32, params.n_prev)),
        /* .cur    = */ {},
        /* .cur_p  = */ {},
    };

    llama_sampler_chain_add(result->chain,
            llama_sampler_init_logit_bias(
                llama_vocab_n_tokens(vocab),
                params.logit_bias.size(),
                params.logit_bias.data()));

    if (params.mirostat == 0) {
        if (params.top_n_sigma >= 0) {
            llama_sampler_chain_add(result->chain, llama_sampler_init_top_k        (params.top_k));
            llama_sampler_chain_add(result->chain, llama_sampler_init_temp         (params.temp));
            llama_sampler_chain_add(result->chain, llama_sampler_init_top_n_sigma  (params.top_n_sigma));
        } else {
            for (const auto & cnstr : params.samplers) {
                switch (cnstr) {
                    case COMMON_SAMPLER_TYPE_DRY:
                        {
                            std::vector<const char *> c_breakers;
                            c_breakers.reserve(params.dry_sequence_breakers.size());
                            for (const auto & str : params.dry_sequence_breakers) {
                                c_breakers.push_back(str.c_str());
                            }

                            llama_sampler_chain_add(result->chain, llama_sampler_init_dry      (vocab, llama_model_n_ctx_train(model), params.dry_multiplier, params.dry_base, params.dry_allowed_length, params.dry_penalty_last_n, c_breakers.data(), c_breakers.size()));
                        }
                        break;
                    case COMMON_SAMPLER_TYPE_TOP_K:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_top_k    (params.top_k));
                        break;
                    case COMMON_SAMPLER_TYPE_TOP_P:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_top_p    (params.top_p, params.min_keep));
                        break;
                    case COMMON_SAMPLER_TYPE_MIN_P:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_min_p    (params.min_p, params.min_keep));
                        break;
                    case COMMON_SAMPLER_TYPE_XTC:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_xtc      (params.xtc_probability, params.xtc_threshold, params.min_keep, params.seed));
                        break;
                    case COMMON_SAMPLER_TYPE_TYPICAL_P:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_typical  (params.typ_p, params.min_keep));
                        break;
                    case COMMON_SAMPLER_TYPE_TEMPERATURE:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_temp_ext (params.temp, params.dynatemp_range, params.dynatemp_exponent));
                        break;
                    case COMMON_SAMPLER_TYPE_INFILL:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_infill   (vocab));
                        break;
                    case COMMON_SAMPLER_TYPE_PENALTIES:
                        llama_sampler_chain_add(result->chain, llama_sampler_init_penalties(params.penalty_last_n, params.penalty_repeat, params.penalty_freq, params.penalty_present));
                        break;
                    default:
                        GGML_ASSERT(false && "unknown sampler type");
                }
            }
        }
        llama_sampler_chain_add(result->chain, llama_sampler_init_dist(params.seed));
    } else if (params.mirostat == 1) {
        llama_sampler_chain_add(result->chain, llama_sampler_init_temp(params.temp));
        llama_sampler_chain_add(result->chain, llama_sampler_init_mirostat(llama_vocab_n_tokens(vocab), params.seed, params.mirostat_tau, params.mirostat_eta, 100));
    } else if (params.mirostat == 2) {
        llama_sampler_chain_add(result->chain, llama_sampler_init_temp(params.temp));
        llama_sampler_chain_add(result->chain, llama_sampler_init_mirostat_v2(params.seed, params.mirostat_tau, params.mirostat_eta));
    } else {
        GGML_ASSERT(false && "unknown mirostat version");
    }

    return result;
}